

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_shm_latency.cpp
# Opt level: O2

void child(void)

{
  char cVar1;
  Reader *__p;
  Writer *__p_00;
  ostream *poVar2;
  vector<char,_std::allocator<char>_> data;
  shared_ptr<diffusion::Writer> in_writer;
  shared_ptr<diffusion::Reader> out_reader;
  allocator<char> local_51;
  string local_50;
  undefined8 *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  long *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"diffusion_latency_test_out",(allocator<char> *)&local_30);
  __p = diffusion::create_shared_memory_reader(&local_50);
  std::__shared_ptr<diffusion::Reader,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<diffusion::Reader,void>
            ((__shared_ptr<diffusion::Reader,(__gnu_cxx::_Lock_policy)2> *)&local_20,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"diffusion_latency_test_in",&local_51);
  __p_00 = diffusion::create_shared_memory_writer(&local_50,0x1000000);
  std::__shared_ptr<diffusion::Writer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<diffusion::Writer,void>
            ((__shared_ptr<diffusion::Writer,(__gnu_cxx::_Lock_policy)2> *)&local_30,__p_00);
  std::__cxx11::string::~string((string *)&local_50);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_50,0x1e8,&local_51);
  do {
    do {
      cVar1 = (**(code **)*local_20)();
    } while (cVar1 == '\0');
    (**(code **)(*local_20 + 0x10))(local_20,&local_50);
    *(int *)(local_50._M_dataplus._M_p + 0x1e0) = *(int *)(local_50._M_dataplus._M_p + 0x1e0) + 1;
    cVar1 = local_50._M_dataplus._M_p[0x1e4];
    (**(code **)*local_30)(local_30,&local_50);
  } while (cVar1 == '\0');
  poVar2 = std::operator<<((ostream *)&std::cout,"Child process terminated");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void child() {
    auto out_reader = std::shared_ptr<diffusion::Reader>(diffusion::create_shared_memory_reader(shm_out_name));
    auto in_writer = std::shared_ptr<diffusion::Writer>(diffusion::create_shared_memory_writer(shm_in_name, shm_size));
    std::vector<char> data(sizeof(Message));
    while (true) {
        if (out_reader->can_read()) {
            out_reader->read(data);
            auto message_pointer = reinterpret_cast<Message *>(data.data());
            ++message_pointer->num_passes;
            bool is_last_message = message_pointer->is_last_message;
            in_writer->write(data);
            if (is_last_message) {
                break;
            }
        }
    }
    std::cout << "Child process terminated" << std::endl;
}